

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

internals * pybind11::detail::get_internals(void)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  internals *piVar4;
  long lVar5;
  char *id;
  handle builtins;
  object local_50;
  handle local_48;
  char *local_40;
  undefined8 local_38;
  item_accessor local_30;
  
  if (get_internals::internals_ptr == (internals *)0x0) {
    local_38 = PyEval_GetBuiltins();
    local_40 = "__pybind11_2_1__";
    bVar2 = object_api<pybind11::handle>::contains<char_const*&>
                      ((object_api<pybind11::handle> *)&local_38,&local_40);
    if (bVar2) {
      object_api<pybind11::handle>::operator[]
                (&local_30,(object_api<pybind11::handle> *)&local_38,local_40);
      accessor::operator_cast_to_object((accessor *)&local_50);
      if (local_50.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11::object::~object(&local_50);
        accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_30);
      }
      else {
        pPVar1 = *(PyTypeObject **)((long)local_50.super_handle.m_ptr + 8);
        pybind11::object::~object(&local_50);
        accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_30);
        if (pPVar1 == (PyTypeObject *)&PyCapsule_Type) {
          object_api<pybind11::handle>::operator[]
                    (&local_30,(object_api<pybind11::handle> *)&local_38,local_40);
          accessor::operator_cast_to_object((accessor *)&local_48);
          local_50.super_handle.m_ptr = (handle)(handle)local_48.m_ptr;
          local_48.m_ptr = (PyObject *)0x0;
          get_internals::internals_ptr = capsule::operator_cast_to_internals_((capsule *)&local_50);
          pybind11::object::~object(&local_50);
          pybind11::object::~object((object *)&local_48);
          accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_30);
          return get_internals::internals_ptr;
        }
      }
    }
    piVar4 = (internals *)operator_new(0x168);
    memset(piVar4,0,0x168);
    internals::internals(piVar4);
    get_internals::internals_ptr = piVar4;
    PyEval_InitThreads();
    lVar5 = PyThreadState_Get();
    iVar3 = PyThread_create_key();
    get_internals::internals_ptr->tstate = iVar3;
    PyThread_set_key_value(iVar3,lVar5);
    piVar4 = get_internals::internals_ptr;
    get_internals::internals_ptr->istate = *(PyInterpreterState **)(lVar5 + 0x10);
    capsule::capsule((capsule *)&local_50,piVar4,(_func_void_PyObject_ptr *)0x0);
    object_api<pybind11::handle>::operator[]
              (&local_30,(object_api<pybind11::handle> *)&local_38,local_40);
    accessor<pybind11::detail::accessor_policies::generic_item>::operator=
              (&local_30,(capsule *)&local_50);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_30);
    pybind11::object::~object(&local_50);
    local_30._0_8_ =
         get_internals()::{lambda(std::__exception_ptr::exception_ptr)#1}::exception_ptr_;
    std::
    forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
    ::push_front(&get_internals::internals_ptr->registered_exception_translators,
                 (_func_void_exception_ptr **)&local_30);
  }
  return get_internals::internals_ptr;
}

Assistant:

PYBIND11_NOINLINE inline internals &get_internals() {
    static internals *internals_ptr = nullptr;
    if (internals_ptr)
        return *internals_ptr;
    handle builtins(PyEval_GetBuiltins());
    const char *id = PYBIND11_INTERNALS_ID;
    if (builtins.contains(id) && isinstance<capsule>(builtins[id])) {
        internals_ptr = capsule(builtins[id]);
    } else {
        internals_ptr = new internals();
        #if defined(WITH_THREAD)
            PyEval_InitThreads();
            PyThreadState *tstate = PyThreadState_Get();
            internals_ptr->tstate = PyThread_create_key();
            PyThread_set_key_value(internals_ptr->tstate, tstate);
            internals_ptr->istate = tstate->interp;
        #endif
        builtins[id] = capsule(internals_ptr);
        internals_ptr->registered_exception_translators.push_front(
            [](std::exception_ptr p) -> void {
                try {
                    if (p) std::rethrow_exception(p);
                } catch (error_already_set &e)           { e.restore();                                    return;
                } catch (const builtin_exception &e)     { e.set_error();                                  return;
                } catch (const std::bad_alloc &e)        { PyErr_SetString(PyExc_MemoryError,   e.what()); return;
                } catch (const std::domain_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::invalid_argument &e) { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::length_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::out_of_range &e)     { PyErr_SetString(PyExc_IndexError,    e.what()); return;
                } catch (const std::range_error &e)      { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::exception &e)        { PyErr_SetString(PyExc_RuntimeError,  e.what()); return;
                } catch (...) {
                    PyErr_SetString(PyExc_RuntimeError, "Caught an unknown exception!");
                    return;
                }
            }
        );
    }
    return *internals_ptr;
}